

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

uint64_t VP8LHistogramEstimateBits(VP8LHistogram *h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  long lVar4;
  HistogramIndex index;
  int length;
  uint32_t *population;
  
  lVar4 = 0;
  for (index = LITERAL; index != (DISTANCE|RED); index = index + RED) {
    GetPopulationInfo(h,index,&population,&length);
    uVar3 = PopulationCost(population,length,(uint16_t *)0x0,(uint8_t *)0x0);
    lVar4 = lVar4 + uVar3;
  }
  uVar1 = (*VP8LExtraCost)(h->literal + 0x100,0x18);
  uVar2 = (*VP8LExtraCost)(h->distance,0x28);
  return (ulong)(uVar2 + uVar1) * 0x800000 + lVar4;
}

Assistant:

uint64_t VP8LHistogramEstimateBits(const VP8LHistogram* const h) {
  int i;
  uint64_t cost = 0;
  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t* population;
    GetPopulationInfo(h, (HistogramIndex)i, &population, &length);
    cost += PopulationCost(population, length, /*trivial_sym=*/NULL,
                           /*is_used=*/NULL);
  }
  cost += ((uint64_t)(VP8LExtraCost(h->literal + NUM_LITERAL_CODES,
                                    NUM_LENGTH_CODES) +
                      VP8LExtraCost(h->distance, NUM_DISTANCE_CODES))
           << LOG_2_PRECISION_BITS);
  return cost;
}